

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPN::Reset(OPN *this)

{
  int i;
  uint uVar1;
  
  uVar1 = 0x20;
  do {
    SetReg(this,uVar1,0);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x28);
  uVar1 = 0x30;
  do {
    SetReg(this,uVar1,0);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0xc0);
  (this->super_OPNBase).status = 0;
  OPNBase::SetPrescaler(&this->super_OPNBase,0);
  (this->super_OPNBase).super_Timer.timera_count = 0;
  (this->super_OPNBase).super_Timer.timerb_count = 0;
  PSG::Reset(&(this->super_OPNBase).psg);
  Channel4::Reset((Channel4 *)&this->field_0x1d8);
  Channel4::Reset((Channel4 *)&this->field_0x4b8);
  Channel4::Reset((Channel4 *)&this->field_0x798);
  return;
}

Assistant:

void OPN::Reset()
{
	int i;
	for (i=0x20; i<0x28; i++) SetReg(i, 0);
	for (i=0x30; i<0xc0; i++) SetReg(i, 0);
	OPNBase::Reset();
	ch[0].Reset();
	ch[1].Reset();
	ch[2].Reset();
}